

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O0

uint64_t __thiscall pager::append_page(pager *this)

{
  bool bVar1;
  uint32_t lastVal;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  runtime_error *this_00;
  int err;
  uint32_t lastNBlocks;
  pager *this_local;
  
  do {
    lastVal = _read_nblocks(this);
    __stream = (FILE *)r_file::operator_cast_to__IO_FILE_(&this->_f);
    iVar2 = fileno(__stream);
    sVar3 = block_size();
    iVar2 = ftruncate(iVar2,(lastVal + 1) * sVar3);
    if (iVar2 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"ftruncate failed");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = _update_nblocks(this,lastVal,lastVal + 1);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  sVar3 = block_size();
  return lastVal * sVar3;
}

Assistant:

uint64_t pager::append_page() const
{
    uint32_t lastNBlocks;

    // The idea here is that we want to append space for 1 block to the end of the file and update our
    // nblocks field in the special block at the beginning of the file. We'd also like to return the file
    // offset of the new blocks.
    //
    // To keep this lock free I'm calling _update_nblocks() (which uses the gcc compiler intrinsic for
    // compare and swap).

    do {
        lastNBlocks = _read_nblocks();
        auto err = ftruncate(fileno(_f), ((lastNBlocks+1)*pager::block_size()));
        if(err != 0)
            throw std::runtime_error("ftruncate failed");
    } while(!_update_nblocks(lastNBlocks, lastNBlocks+1));
    
    //return pager::block_size() + (lastNBlocks * pager::block_size());
    return lastNBlocks * pager::block_size();
}